

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

int Bac_NtkDeriveFromPtr(Bac_Ntk_t *pNtk,Vec_Ptr_t *vNtk,Vec_Int_t *vMap,Vec_Int_t *vBox2Id)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  void **ppvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  Bac_Man_t *pBVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  Bac_Ntk_t *pBVar16;
  char *pcVar17;
  long lVar18;
  char *pcVar19;
  Bac_ObjType_t Type;
  int i;
  long lVar20;
  uint uVar21;
  long lVar22;
  
  uVar10 = vNtk->nSize;
  if (((((int)uVar10 < 1) || (uVar10 == 1)) || (uVar10 < 3)) || (uVar10 < 5)) {
LAB_00394a58:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar3 = vNtk->pArray;
  pcVar17 = (char *)*ppvVar3;
  pvVar4 = ppvVar3[1];
  pvVar5 = ppvVar3[2];
  pvVar6 = ppvVar3[4];
  iVar9 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar17,(int *)0x0);
  if (pNtk->NameId != iVar9) {
    pcVar19 = "Bac_NtkNameId(pNtk) == NameId";
    pcVar14 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c";
    pcVar17 = "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)";
LAB_00394aab:
    __assert_fail(pcVar19,pcVar14,0x11d,pcVar17);
  }
  if (0 < *(int *)((long)pvVar4 + 4)) {
    pVVar1 = &pNtk->vInfo;
    lVar15 = 0;
    do {
      pcVar14 = *(char **)(*(long *)((long)pvVar4 + 8) + lVar15 * 8);
      uVar10 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar14,(int *)0x0);
      Vec_IntFillExtra(vMap,uVar10 + 1,-1);
      if (((int)uVar10 < 0) || (vMap->nSize <= (int)uVar10)) goto LAB_003949dc;
      if (vMap->pArray[uVar10] != -1) {
        pcVar19 = "PI with name \"%s\" is not unique module \"%s\".\n";
LAB_003947e1:
        printf(pcVar19,pcVar14,pcVar17);
        return 0;
      }
      uVar11 = Bac_ObjAlloc(pNtk,BAC_OBJ_PI,-1);
      iVar9 = Bac_ObjName(pNtk,uVar11);
      if (iVar9 != 0) goto LAB_00394a39;
      if (((int)uVar11 < 0) || ((pNtk->vType).nSize <= (int)uVar11)) goto LAB_00394a1a;
      if (((pNtk->vType).pArray[uVar11] & 0xfcU) == 4) goto LAB_00394a39;
      Vec_IntFillExtra(&pNtk->vName,uVar11 + 1,0);
      if ((pNtk->vName).nSize <= (int)uVar11) goto LAB_003949fb;
      (pNtk->vName).pArray[uVar11] = uVar10 * 4;
      Vec_IntFillExtra(vMap,uVar10 + 1,-1);
      if (vMap->nSize <= (int)uVar10) goto LAB_003949fb;
      vMap->pArray[uVar10] = uVar11;
      Vec_IntPush(pVVar1,uVar10 * 4 | 1);
      Vec_IntPush(pVVar1,-1);
      Vec_IntPush(pVVar1,-1);
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)((long)pvVar4 + 4));
  }
  vBox2Id->nSize = 0;
  if (*(int *)((long)pvVar6 + 4) < 1) {
    if (*(int *)((long)pvVar6 + 4) != 0) goto LAB_00394b89;
  }
  else {
    pVVar1 = &pNtk->vFanin;
    lVar15 = 0;
    do {
      lVar20 = *(long *)(*(long *)((long)pvVar6 + 8) + lVar15 * 8);
      if ((*(int *)(lVar20 + 4) < 1) || (*(int *)(lVar20 + 4) == 1)) goto LAB_00394a58;
      pcVar14 = (char *)**(undefined8 **)(lVar20 + 8);
      pcVar19 = (char *)(*(undefined8 **)(lVar20 + 8))[1];
      uVar10 = Abc_NamStrFind(pNtk->pDesign->pMods,pcVar14);
      if (uVar10 == 0) {
        uVar10 = 1;
      }
      else {
        uVar10 = pNtk->pDesign->pNtks[uVar10].vOutputs.nCap;
      }
      iVar9 = *(int *)(lVar20 + 4);
      uVar11 = Abc_NamStrFind(pNtk->pDesign->pMods,pcVar14);
      if ((*(uint *)(lVar20 + 4) & 1) != 0) {
        __assert_fail("Vec_PtrSize(vBox) % 2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                      ,0x132,
                      "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (((int)uVar10 < 1) || ((int)*(uint *)(lVar20 + 4) < (int)(uVar10 * 2 + 2))) {
        __assert_fail("nOutputs > 0 && 2*(nOutputs + 1) <= Vec_PtrSize(vBox)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                      ,0x133,
                      "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar12 = strcmp(pcVar14,"Const0T");
      if (iVar12 == 0) {
        Type = BAC_BOX_CF;
      }
      else {
        iVar12 = strcmp(pcVar14,"Const1T");
        if (iVar12 == 0) {
          Type = BAC_BOX_CT;
        }
        else {
          iVar12 = strcmp(pcVar14,"BufT");
          if (iVar12 == 0) {
            Type = BAC_BOX_BUF;
          }
          else {
            iVar12 = strcmp(pcVar14,"InvT");
            if (iVar12 == 0) {
              Type = BAC_BOX_INV;
            }
            else {
              iVar12 = strcmp(pcVar14,"AndT");
              if (iVar12 == 0) {
                Type = BAC_BOX_AND;
              }
              else {
                iVar12 = strcmp(pcVar14,"NandT");
                if (iVar12 == 0) {
                  Type = BAC_BOX_NAND;
                }
                else {
                  iVar12 = strcmp(pcVar14,"OrT");
                  if (iVar12 == 0) {
                    Type = BAC_BOX_OR;
                  }
                  else {
                    iVar12 = strcmp(pcVar14,"NorT");
                    if (iVar12 == 0) {
                      Type = BAC_BOX_NOR;
                    }
                    else {
                      iVar12 = strcmp(pcVar14,"XorT");
                      if (iVar12 == 0) {
                        Type = BAC_BOX_XOR;
                      }
                      else {
                        iVar12 = strcmp(pcVar14,"XnorT");
                        Type = BAC_OBJ_BOX;
                        if (iVar12 == 0) {
                          Type = BAC_BOX_XNOR;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar9 = iVar9 / 2;
      if (0 < (int)(~uVar10 + iVar9)) {
        uVar21 = iVar9 - uVar10;
        do {
          uVar13 = (pNtk->vType).nSize;
          if (uVar13 != (pNtk->vFanin).nSize) goto LAB_003949bd;
          if (uVar13 == (pNtk->vType).nCap) {
            if ((int)uVar13 < 0x10) {
              pcVar14 = (pNtk->vType).pArray;
              if (pcVar14 == (char *)0x0) {
                pcVar14 = (char *)malloc(0x10);
              }
              else {
                pcVar14 = (char *)realloc(pcVar14,0x10);
              }
              (pNtk->vType).pArray = pcVar14;
              (pNtk->vType).nCap = 0x10;
            }
            else {
              sVar8 = (ulong)uVar13 * 2;
              pcVar14 = (pNtk->vType).pArray;
              if (pcVar14 == (char *)0x0) {
                pcVar14 = (char *)malloc(sVar8);
              }
              else {
                pcVar14 = (char *)realloc(pcVar14,sVar8);
              }
              (pNtk->vType).pArray = pcVar14;
              (pNtk->vType).nCap = (int)sVar8;
            }
          }
          else {
            pcVar14 = (pNtk->vType).pArray;
          }
          iVar9 = (pNtk->vType).nSize;
          (pNtk->vType).nSize = iVar9 + 1;
          pcVar14[iVar9] = '\x06';
          Vec_IntPush(pVVar1,-1);
          uVar21 = uVar21 - 1;
        } while (1 < uVar21);
      }
      uVar13 = Bac_ObjAlloc(pNtk,Type,uVar11);
      uVar21 = uVar10;
      do {
        uVar2 = (pNtk->vType).nSize;
        if (uVar2 != (pNtk->vFanin).nSize) {
LAB_003949bd:
          __assert_fail("iObj == Vec_IntSize(&p->vFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0x19f,"int Bac_ObjAlloc(Bac_Ntk_t *, Bac_ObjType_t, int)");
        }
        if (uVar2 == (pNtk->vType).nCap) {
          if ((int)uVar2 < 0x10) {
            pcVar14 = (pNtk->vType).pArray;
            if (pcVar14 == (char *)0x0) {
              pcVar14 = (char *)malloc(0x10);
            }
            else {
              pcVar14 = (char *)realloc(pcVar14,0x10);
            }
            (pNtk->vType).pArray = pcVar14;
            (pNtk->vType).nCap = 0x10;
          }
          else {
            sVar8 = (ulong)uVar2 * 2;
            pcVar14 = (pNtk->vType).pArray;
            if (pcVar14 == (char *)0x0) {
              pcVar14 = (char *)malloc(sVar8);
            }
            else {
              pcVar14 = (char *)realloc(pcVar14,sVar8);
            }
            (pNtk->vType).pArray = pcVar14;
            (pNtk->vType).nCap = (int)sVar8;
          }
        }
        else {
          pcVar14 = (pNtk->vType).pArray;
        }
        iVar9 = (pNtk->vType).nSize;
        (pNtk->vType).nSize = iVar9 + 1;
        pcVar14[iVar9] = '\b';
        Vec_IntPush(pVVar1,-1);
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
      pBVar7 = pNtk->pDesign;
      if (0 < (int)uVar11) {
        pBVar16 = (Bac_Ntk_t *)0x0;
        if ((int)uVar11 <= pBVar7->nNtks) {
          pBVar16 = pBVar7->pNtks + uVar11;
        }
        iVar9 = (int)((ulong)((long)pNtk - (long)pBVar7->pNtks) >> 4) * -0x3b13b13b;
        if ((iVar9 < 1) || (pBVar7->nNtks < iVar9)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (pBVar16->iBoxNtk != -1) {
          __assert_fail("p->iBoxNtk == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
        }
        pBVar16->iBoxNtk = iVar9;
        pBVar16->iBoxObj = uVar13;
      }
      iVar9 = Abc_NamStrFindOrAdd(pBVar7->pStrs,pcVar19,(int *)0x0);
      iVar12 = Bac_ObjName(pNtk,uVar13);
      if (iVar12 != 0) {
LAB_00394a39:
        __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
      }
      if (((int)uVar13 < 0) || ((pNtk->vType).nSize <= (int)uVar13)) {
LAB_00394a1a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (((pNtk->vType).pArray[uVar13] & 0xfcU) == 4) goto LAB_00394a39;
      Vec_IntFillExtra(&pNtk->vName,uVar13 + 1,0);
      if ((pNtk->vName).nSize <= (int)uVar13) goto LAB_003949fb;
      (pNtk->vName).pArray[uVar13] = iVar9 << 2;
      if ((int)(uVar13 + 1) < (pNtk->vType).nSize) {
        iVar9 = uVar10 * -2;
        lVar22 = 0;
        do {
          if (((pNtk->vType).pArray[lVar22 + 1 + (ulong)uVar13] & 0xfeU) != 8) break;
          iVar12 = *(int *)(lVar20 + 4);
          if ((iVar9 + iVar12 < -1) || (uVar10 = iVar9 + iVar12 + 1, iVar12 <= (int)uVar10))
          goto LAB_00394a58;
          pcVar14 = *(char **)(*(long *)(lVar20 + 8) + (ulong)uVar10 * 8);
          uVar10 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar14,(int *)0x0);
          Vec_IntFillExtra(vMap,uVar10 + 1,-1);
          if (((int)uVar10 < 0) || (vMap->nSize <= (int)uVar10)) goto LAB_003949dc;
          if (vMap->pArray[uVar10] != -1) {
            pcVar19 = "Signal \"%s\" has multiple drivers in module \"%s\".\n";
            goto LAB_003947e1;
          }
          i = (int)lVar22 + uVar13 + 1;
          iVar12 = Bac_ObjName(pNtk,i);
          if (iVar12 != 0) goto LAB_00394a39;
          if ((pNtk->vType).nSize <= i) goto LAB_00394a1a;
          if (((pNtk->vType).pArray[lVar22 + 1 + (ulong)uVar13] & 0xfcU) == 4) goto LAB_00394a39;
          Vec_IntFillExtra(&pNtk->vName,(int)lVar22 + uVar13 + 2,0);
          if ((pNtk->vName).nSize <= i) goto LAB_003949fb;
          (pNtk->vName).pArray[(ulong)uVar13 + lVar22 + 1] = uVar10 * 4;
          Vec_IntFillExtra(vMap,uVar10 + 1,-1);
          if (vMap->nSize <= (int)uVar10) goto LAB_003949fb;
          vMap->pArray[uVar10] = i;
          lVar22 = lVar22 + 1;
          iVar9 = iVar9 + 2;
        } while ((int)((int)lVar22 + uVar13 + 1) < (pNtk->vType).nSize);
      }
      Vec_IntPush(vBox2Id,uVar13);
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)((long)pvVar6 + 4));
    iVar9 = vBox2Id->nSize;
    if (iVar9 != *(int *)((long)pvVar6 + 4)) {
LAB_00394b89:
      __assert_fail("Vec_IntSize(vBox2Id) == Vec_PtrSize(vBoxes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x143,
                    "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (0 < iVar9) {
      lVar15 = 0;
      do {
        if (vBox2Id->nSize <= lVar15) goto LAB_003949dc;
        lVar20 = (long)vBox2Id->pArray[lVar15];
        if (0 < lVar20) {
          lVar22 = *(long *)(*(long *)((long)pvVar6 + 8) + lVar15 * 8);
          lVar18 = 3;
          do {
            if ((pNtk->vType).nSize < lVar20) goto LAB_00394a1a;
            if (((pNtk->vType).pArray[lVar20 + -1] & 0xfeU) != 6) break;
            if (*(int *)(lVar22 + 4) <= (int)lVar18) goto LAB_00394a58;
            pcVar14 = *(char **)(*(long *)(lVar22 + 8) + lVar18 * 8);
            uVar10 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar14,(int *)0x0);
            Vec_IntFillExtra(vMap,uVar10 + 1,-1);
            if (((int)uVar10 < 0) || (vMap->nSize <= (int)uVar10)) goto LAB_003949dc;
            if (vMap->pArray[uVar10] == -1) {
              printf("Signal \"%s\" in not driven in module \"%s\".\n",pcVar14,pcVar17);
            }
            Vec_IntFillExtra(vMap,uVar10 + 1,-1);
            if (vMap->nSize <= (int)uVar10) goto LAB_003949dc;
            if ((pNtk->vType).nSize < lVar20) goto LAB_00394a1a;
            if (((pNtk->vType).pArray[lVar20 + -1] & 0xfcU) != 4) {
              pcVar19 = "Bac_ObjIsCo(p, i)";
              pcVar14 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
              ;
              pcVar17 = "int Bac_ObjFanin(Bac_Ntk_t *, int)";
              goto LAB_00394aab;
            }
            if ((pNtk->vFanin).nSize < lVar20) goto LAB_003949dc;
            if ((pNtk->vFanin).pArray[lVar20 + -1] != -1) {
              __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
            }
            iVar9 = vMap->pArray[uVar10];
            Vec_IntFillExtra(pVVar1,(int)lVar20,0);
            if ((pNtk->vFanin).nSize < lVar20) goto LAB_003949fb;
            (pNtk->vFanin).pArray[lVar20 + -1] = iVar9;
            lVar20 = lVar20 + -1;
            lVar18 = lVar18 + 2;
          } while (lVar20 != 0);
          iVar9 = *(int *)((long)pvVar6 + 4);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < iVar9);
    }
  }
  if (0 < *(int *)((long)pvVar5 + 4)) {
    pVVar1 = &pNtk->vInfo;
    lVar15 = 0;
    do {
      pcVar14 = *(char **)(*(long *)((long)pvVar5 + 8) + lVar15 * 8);
      uVar10 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar14,(int *)0x0);
      Vec_IntFillExtra(vMap,uVar10 + 1,-1);
      if (((int)uVar10 < 0) || (vMap->nSize <= (int)uVar10)) {
LAB_003949dc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vMap->pArray[uVar10] == -1) {
        printf("PO with name \"%s\" in not driven in module \"%s\".\n",pcVar14,pcVar17);
      }
      Vec_IntFillExtra(vMap,uVar10 + 1,-1);
      if (vMap->nSize <= (int)uVar10) goto LAB_003949dc;
      Bac_ObjAlloc(pNtk,BAC_OBJ_PO,vMap->pArray[uVar10]);
      Vec_IntPush(pVVar1,uVar10 * 4 + 2);
      Vec_IntPush(pVVar1,-1);
      Vec_IntPush(pVVar1,-1);
      lVar15 = lVar15 + 1;
    } while (lVar15 < *(int *)((long)pvVar5 + 4));
  }
  iVar9 = (pNtk->vType).nSize;
  if (0 < iVar9) {
    lVar15 = 0;
    do {
      uVar10 = (uint)(byte)(pNtk->vType).pArray[lVar15];
      if ((uVar10 < 10) && ((0x30cU >> (uVar10 & 0x1f) & 1) != 0)) {
        uVar10 = Bac_ObjName(pNtk,(int)lVar15);
        if ((int)uVar10 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x13d,"int Abc_Lit2Var2(int)");
        }
        uVar10 = uVar10 >> 2;
        Vec_IntFillExtra(vMap,uVar10 + 1,-1);
        if (vMap->nSize <= (int)uVar10) {
LAB_003949fb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[uVar10] = -1;
        iVar9 = (pNtk->vType).nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar9);
  }
  if (0 < (long)vMap->nSize) {
    lVar15 = 0;
    do {
      if (vMap->pArray[lVar15] != -1) {
        __assert_fail("iObj == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                      ,0x15f,
                      "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      lVar15 = lVar15 + 1;
    } while (vMap->nSize != lVar15);
  }
  if (iVar9 == (pNtk->vType).nCap) {
    return 1;
  }
  __assert_fail("Bac_NtkObjNum(pNtk) == Vec_StrCap(&pNtk->vType)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x160,
                "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Bac_NtkDeriveFromPtr( Bac_Ntk_t * pNtk, Vec_Ptr_t * vNtk, Vec_Int_t * vMap, Vec_Int_t * vBox2Id )
{
    char * pName, * pModuleName = (char *)Vec_PtrEntry(vNtk, 0);
    Vec_Ptr_t * vInputs  = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vBoxes   = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4), * vBox;
    int i, k, iObj, iTerm, NameId;
    // start network with the given name
    NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pModuleName, NULL );
    assert( Bac_NtkNameId(pNtk) == NameId );
    // map driven NameIds into their ObjIds for PIs
    Vec_PtrForEachEntry( char *, vInputs, pName, i )
    {
        NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
        if ( Vec_IntGetEntryFull(vMap, NameId) != -1 )
            { printf( "PI with name \"%s\" is not unique module \"%s\".\n", pName, pModuleName ); return 0; }
        iObj = Bac_ObjAlloc( pNtk, BAC_OBJ_PI, -1 );
        Bac_ObjSetName( pNtk, iObj, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
        Vec_IntSetEntryFull( vMap, NameId, iObj );
        Bac_NtkAddInfo( pNtk, Abc_Var2Lit2(NameId, 1), -1, -1 );
    }
    // map driven NameIds into their ObjIds for BOs
    Vec_IntClear( vBox2Id );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
    {
        char * pBoxNtk = (char *)Vec_PtrEntry(vBox, 0);
        char * pBoxName = (char *)Vec_PtrEntry(vBox, 1);
        int nOutputs = Bac_BoxCountOutputs( pNtk, pBoxNtk );
        int nInputs = Vec_PtrSize(vBox)/2 - nOutputs - 1;
        int NtkId = Bac_ManNtkFindId( pNtk->pDesign, pBoxNtk );
        assert( Vec_PtrSize(vBox) % 2 == 0 );
        assert( nOutputs > 0 && 2*(nOutputs + 1) <= Vec_PtrSize(vBox) );
        iObj = Bac_BoxAlloc( pNtk, (Bac_ObjType_t)Ptr_NameToType(pBoxNtk), nInputs, nOutputs, NtkId );
        if ( NtkId > 0 )
            Bac_NtkSetHost( Bac_ManNtk(pNtk->pDesign, NtkId), Bac_NtkId(pNtk), iObj );
        Bac_ObjSetName( pNtk, iObj, Abc_Var2Lit2(Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs, pBoxName, NULL), BAC_NAME_BIN) );
        Bac_BoxForEachBo( pNtk, iObj, iTerm, k )
        {
            pName = (char *)Vec_PtrEntry( vBox, Vec_PtrSize(vBox) - 2*(nOutputs - k) + 1 );
            NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
            if ( Vec_IntGetEntryFull(vMap, NameId) != -1 )
                { printf( "Signal \"%s\" has multiple drivers in module \"%s\".\n", pName, pModuleName ); return 0; }
            Bac_ObjSetName( pNtk, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
            Vec_IntSetEntryFull( vMap, NameId, iTerm );
        }
        Vec_IntPush( vBox2Id, iObj );
    }
    assert( Vec_IntSize(vBox2Id) == Vec_PtrSize(vBoxes) );
    // connect BIs
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
    {
        iObj = Vec_IntEntry( vBox2Id, i );
        Bac_BoxForEachBi( pNtk, iObj, iTerm, k )
        {
            pName = (char *)Vec_PtrEntry( vBox, 2*(k + 1) + 1 );
            NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
            if ( Vec_IntGetEntryFull(vMap, NameId) == -1 )
                printf( "Signal \"%s\" in not driven in module \"%s\".\n", pName, pModuleName );
            Bac_ObjSetFanin( pNtk, iTerm, Vec_IntGetEntryFull(vMap, NameId) );
        }
    }
    // connect POs
    Vec_PtrForEachEntry( char *, vOutputs, pName, i )
    {
        NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
        if ( Vec_IntGetEntryFull(vMap, NameId) == -1 )
            printf( "PO with name \"%s\" in not driven in module \"%s\".\n", pName, pModuleName );
        iObj = Bac_ObjAlloc( pNtk, BAC_OBJ_PO, Vec_IntGetEntryFull(vMap, NameId) );
        Bac_NtkAddInfo( pNtk, Abc_Var2Lit2(NameId, 2), -1, -1 );
    }
    // update map
    Bac_NtkForEachCi( pNtk, iObj )
        Vec_IntSetEntryFull( vMap, Bac_ObjNameId(pNtk, iObj), -1 );
    // double check
    Vec_IntForEachEntry( vMap, iObj, i )
        assert( iObj == -1 );
    assert( Bac_NtkObjNum(pNtk) == Vec_StrCap(&pNtk->vType) );
    return 1;
}